

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_connector_change_table.c
# Opt level: O2

void apx_portConnectorChangeTable_destroy(apx_portConnectorChangeTable_t *self)

{
  long lVar1;
  ulong uVar2;
  
  if ((self != (apx_portConnectorChangeTable_t *)0x0) &&
     (self->entries != (apx_portConnectorChangeEntry_t *)0x0)) {
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < self->num_ports; uVar2 = uVar2 + 1) {
      apx_portConnectorChangeEntry_destroy
                ((apx_portConnectorChangeEntry_t *)((long)&self->entries->count + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    free(self->entries);
    return;
  }
  return;
}

Assistant:

void apx_portConnectorChangeTable_destroy(apx_portConnectorChangeTable_t *self)
{
   if ( (self != NULL) && (self->entries != 0))
   {
      apx_size_t i;
      for (i=0u; i<self->num_ports; i++)
      {
         apx_portConnectorChangeEntry_destroy(&self->entries[i]);
      }
      free(self->entries);
   }
}